

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::
StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
::WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  ParquetUUIDTargetType target_value_00;
  ParquetUUIDTargetType target_value_01;
  ParquetUUIDTargetType target_value_02;
  ParquetUUIDTargetType target_value_03;
  ParquetUUIDTargetType target_value_04;
  bool bVar1;
  StandardWriterPageState<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
  *pSVar2;
  TemplatedValidityMask<unsigned_long> *this_00;
  hugeint_t *phVar3;
  InternalException *this_01;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  BssEncoder *in_RDI;
  ulong in_R9;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  ulong in_stack_00000008;
  ParquetUUIDTargetType target_value_4;
  idx_t r_3;
  ParquetUUIDTargetType target_value_3;
  ParquetUUIDTargetType target_value_2;
  idx_t r_2;
  ParquetUUIDTargetType target_value_1;
  ParquetUUIDTargetType target_value;
  idx_t r_1;
  uint32_t value_index;
  hugeint_t *src_value;
  idx_t r;
  hugeint_t *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
  *page_state;
  WriteStream *in_stack_00007e68;
  ValidityMask *in_stack_00007e70;
  idx_t in_stack_00007e78;
  idx_t in_stack_00007e80;
  ColumnWriterStatistics *in_stack_00007e88;
  Vector *in_stack_00007e90;
  undefined7 in_stack_fffffffffffffe28;
  uchar in_stack_fffffffffffffe2f;
  ClientContext *in_stack_fffffffffffffe30;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe38;
  allocator *paVar4;
  RleBpEncoder *in_stack_fffffffffffffe40;
  Allocator *in_stack_fffffffffffffe48;
  ParquetUUIDTargetType *in_stack_fffffffffffffe68;
  ParquetUUIDTargetType *in_stack_fffffffffffffe70;
  Allocator *in_stack_fffffffffffffe78;
  DlbaEncoder *in_stack_fffffffffffffe80;
  ulong local_138;
  ulong local_d0;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>>
                     ((ColumnWriterPageState *)in_stack_fffffffffffffe30);
  this_00 = &FlatVector::Validity((Vector *)0x231998e)->super_TemplatedValidityMask<unsigned_long>;
  phVar3 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x23199a3);
  switch(pSVar2->encoding) {
  case PLAIN:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
                (in_stack_00007e90,in_stack_00007e88,in_stack_00007e80,in_stack_00007e78,
                 in_stack_00007e70,in_stack_00007e68);
    }
    else {
      TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
                (in_stack_00007e90,in_stack_00007e88,in_stack_00007e80,in_stack_00007e78,
                 in_stack_00007e70,in_stack_00007e68);
    }
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar4 = (allocator *)&stack0xfffffffffffffe77;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffe78,"Unknown encoding",paVar4);
    InternalException::InternalException
              (this_01,(string *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
  case DELTA_BINARY_PACKED:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          input.upper = extraout_RDX;
          input.lower = phVar3[local_68].upper;
          ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)phVar3[local_68].lower,input);
          target_value_00.bytes._8_8_ = in_stack_fffffffffffffe40;
          target_value_00.bytes._0_8_ = in_stack_fffffffffffffe38;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_00);
          DbpEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    (&in_stack_fffffffffffffe80->dbp_encoder,
                     (WriteStream *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_00.upper = extraout_RDX_00;
        input_00.lower = phVar3[local_68].upper;
        ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)phVar3[local_68].lower,input_00);
        target_value_01.bytes._8_8_ = in_stack_fffffffffffffe40;
        target_value_01.bytes._0_8_ = in_stack_fffffffffffffe38;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_01);
        DbpEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                  (&in_stack_fffffffffffffe80->dbp_encoder,(WriteStream *)in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe70);
      }
    }
    break;
  case DELTA_LENGTH_BYTE_ARRAY:
    local_d0 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_d0 < in_stack_00000008; local_d0 = local_d0 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          input_01.upper = extraout_RDX_01;
          input_01.lower = phVar3[local_d0].upper;
          ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)phVar3[local_d0].lower,input_01);
          target_value_02.bytes._8_8_ = in_stack_fffffffffffffe40;
          target_value_02.bytes._0_8_ = in_stack_fffffffffffffe38;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_02);
          ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
          BufferAllocator::Get(in_stack_fffffffffffffe30);
          DlbaEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (WriteStream *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          pSVar2->dlba_initialized = true;
          local_d0 = local_d0 + 1;
          break;
        }
      }
    }
    for (; local_d0 < in_stack_00000008; local_d0 = local_d0 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_02.upper = extraout_RDX_02;
        input_02.lower = phVar3[local_d0].upper;
        ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)phVar3[local_d0].lower,input_02);
        target_value_03.bytes._8_8_ = in_stack_fffffffffffffe40;
        target_value_03.bytes._0_8_ = in_stack_fffffffffffffe38;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_03);
        DlbaEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                  (in_stack_fffffffffffffe80,(WriteStream *)in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe70);
      }
    }
    break;
  case RLE_DICTIONARY:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
        ::GetIndex((PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                    *)in_stack_fffffffffffffe30,
                   (hugeint_t *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        RleBpEncoder::WriteValue
                  (in_stack_fffffffffffffe40,(WriteStream *)in_stack_fffffffffffffe38,
                   (uint32_t *)in_stack_fffffffffffffe30);
      }
    }
    break;
  case BYTE_STREAM_SPLIT:
    local_138 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_fffffffffffffe40 = (RleBpEncoder *)&pSVar2->bss_encoder;
      ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
      BufferAllocator::Get(in_stack_fffffffffffffe30);
      BssEncoder::BeginWrite(in_RDI,in_stack_fffffffffffffe48);
      pSVar2->bss_initialized = true;
    }
    for (; local_138 < in_stack_00000008; local_138 = local_138 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_03.upper = extraout_RDX_03;
        input_03.lower = phVar3[local_138].upper;
        ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)phVar3[local_138].lower,input_03);
        target_value_04.bytes._8_8_ = in_stack_fffffffffffffe40;
        target_value_04.bytes._0_8_ = in_stack_fffffffffffffe38;
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_04);
        BssEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                  ((BssEncoder *)in_stack_fffffffffffffe40,
                   (ParquetUUIDTargetType *)in_stack_fffffffffffffe38);
      }
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}